

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  short sVar1;
  Table *pTVar2;
  i16 iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Index *pIdx_00;
  SrcList *pSVar9;
  int in_ECX;
  int in_EDX;
  Table *in_RSI;
  Parse *in_RDI;
  FKey *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000020;
  int in_stack_00000028;
  int eAction;
  SrcItem *pItem;
  SrcList *pSrc;
  char *zCol;
  int rcauth;
  int iReg;
  int iFromCol;
  int iJump;
  Vdbe *v;
  int bIgnore;
  int i;
  int *aiCol;
  Table *pTo;
  int isIgnoreErrors;
  char *zDb;
  int iDb;
  FKey *pFKey;
  sqlite3 *db;
  int *aiCol_1;
  Index *pIdx_1;
  int iCol;
  int *aiFree;
  Index *pIdx;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  uint uVar10;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  sqlite3 *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  Parse *in_stack_ffffffffffffff38;
  sqlite3_vfs *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Vdbe *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  FKey *pFKey_00;
  undefined4 in_stack_ffffffffffffff80;
  char *pcVar11;
  undefined4 in_stack_ffffffffffffff90;
  FKey *local_68;
  sqlite3 *db_00;
  int in_stack_ffffffffffffffa8;
  Parse *pParse_00;
  int local_1c;
  FKey *local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = in_RDI->db;
  uVar4 = (uint)in_RDI->disableTriggers;
  if (((db_00->flags & 0x4000) != 0) && (in_RSI->eTabType == '\0')) {
    iVar5 = sqlite3SchemaToIndex(db_00,in_RSI->pSchema);
    pcVar11 = db_00->aDb[iVar5].zDbSName;
    for (local_68 = (in_RSI->u).tab.pFKey; local_68 != (FKey *)0x0; local_68 = local_68->pNextFrom)
    {
      local_10 = 0;
      local_18 = (FKey *)0x0;
      local_1c = -0x55555556;
      in_stack_ffffffffffffff6c = -0x55555556;
      in_stack_ffffffffffffff68 = 0;
      iVar7 = in_ECX;
      iVar8 = in_EDX;
      if (((in_R8 == (FKey *)0x0) ||
          (iVar6 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                    in_stack_ffffffffffffff08),(char *)0x213bef),
          iVar7 = in_ECX, iVar8 = in_EDX, iVar6 == 0)) ||
         (iVar6 = fkChildIsModified(in_RSI,local_68,(int *)in_R8,in_R9D), iVar7 = in_ECX,
         iVar8 = in_EDX, iVar6 != 0)) {
        if (in_RDI->disableTriggers == '\0') {
          pIdx_00 = (Index *)sqlite3LocateTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                                (char *)in_stack_ffffffffffffff28,
                                                (char *)CONCAT44(in_stack_ffffffffffffff24,
                                                                 in_stack_ffffffffffffff20));
        }
        else {
          pIdx_00 = (Index *)sqlite3FindTable(in_stack_ffffffffffffff28,
                                              (char *)CONCAT44(in_stack_ffffffffffffff24,
                                                               in_stack_ffffffffffffff20),
                                              (char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                               in_stack_ffffffffffffff18));
        }
        in_ECX = iVar7;
        in_EDX = iVar8;
        if ((pIdx_00 == (Index *)0x0) ||
           (iVar6 = sqlite3FkLocateIndex
                              ((Parse *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ),(Table *)in_stack_ffffffffffffff60,
                               (FKey *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                               ,(Index **)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (int **)in_stack_ffffffffffffff48), in_ECX = iVar7, in_EDX = iVar8,
           iVar6 != 0)) {
          if ((uVar4 == 0) || (db_00->mallocFailed != '\0')) goto LAB_0021434c;
          if (pIdx_00 == (Index *)0x0) {
            in_stack_ffffffffffffff60 =
                 sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08));
            iVar7 = sqlite3VdbeCurrentAddr(in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff5c = iVar7 + local_68->nCol + 1;
            for (in_stack_ffffffffffffff6c = 0; in_stack_ffffffffffffff6c < local_68->nCol;
                in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c + 1) {
              in_stack_ffffffffffffff58 = local_68->aCol[in_stack_ffffffffffffff6c].iFrom;
              iVar3 = sqlite3TableColumnToStorage(local_68->pFrom,(i16)in_stack_ffffffffffffff58);
              in_stack_ffffffffffffff54 = iVar3 + in_EDX + 1;
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),in_stack_ffffffffffffff0c,
                                in_stack_ffffffffffffff08,0);
            }
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
          }
        }
        else {
          pFKey_00 = local_18;
          if (local_18 == (FKey *)0x0) {
            local_1c = local_68->aCol[0].iFrom;
            pFKey_00 = (FKey *)&stack0xffffffffffffffe4;
          }
          for (in_stack_ffffffffffffff6c = 0; in_stack_ffffffffffffff6c < local_68->nCol;
              in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c + 1) {
            if (*(int *)(pFKey_00->aAction + (long)in_stack_ffffffffffffff6c * 4 + -0x2d) ==
                (int)in_RSI->iPKey) {
              *(undefined4 *)(pFKey_00->aAction + (long)in_stack_ffffffffffffff6c * 4 + -0x2d) =
                   0xffffffff;
            }
            if (db_00->xAuth != (sqlite3_xauth)0x0) {
              in_stack_ffffffffffffff28 = (sqlite3 *)pIdx_00->aiColumn;
              if (local_10 == 0) {
                sVar1 = *(i16 *)((long)&pIdx_00->pSchema + 4);
              }
              else {
                sVar1 = *(short *)(*(long *)(local_10 + 8) + (long)in_stack_ffffffffffffff6c * 2);
              }
              in_stack_ffffffffffffff24 = (int)sVar1;
              in_stack_ffffffffffffff48 =
                   (&in_stack_ffffffffffffff28->pVfs)[(long)in_stack_ffffffffffffff24 * 2];
              in_stack_ffffffffffffff50 =
                   sqlite3AuthReadCol(in_stack_ffffffffffffff38,
                                      (char *)CONCAT44(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30),
                                      (char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
              in_stack_ffffffffffffff68 = (uint)(in_stack_ffffffffffffff50 == 2);
            }
          }
          sqlite3TableLock((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                           (u8)((uint)in_stack_ffffffffffffff14 >> 0x18),
                           (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          in_RDI->nTab = in_RDI->nTab + 1;
          uVar10 = in_stack_ffffffffffffff68;
          in_EDX = iVar8;
          if (iVar8 != 0) {
            in_stack_ffffffffffffff10 = 0xffffffff;
            fkLookupParent((Parse *)CONCAT44(iVar5,in_stack_ffffffffffffff90),
                           (int)((ulong)pcVar11 >> 0x20),
                           (Table *)CONCAT44(uVar4,in_stack_ffffffffffffff80),pIdx_00,pFKey_00,
                           (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (int)db_00,in_stack_ffffffffffffffa8,(int)in_R8);
            in_stack_ffffffffffffff08 = iVar8;
            in_stack_ffffffffffffff18 = in_stack_ffffffffffffff68;
          }
          in_stack_ffffffffffffff68 = uVar10;
          in_ECX = iVar7;
          if ((iVar7 != 0) &&
             (iVar8 = isSetNullAction(in_RDI,local_68), in_stack_ffffffffffffff68 = uVar10,
             in_ECX = iVar7, iVar8 == 0)) {
            in_stack_ffffffffffffff10 = 1;
            fkLookupParent((Parse *)CONCAT44(iVar5,in_stack_ffffffffffffff90),
                           (int)((ulong)pcVar11 >> 0x20),
                           (Table *)CONCAT44(uVar4,in_stack_ffffffffffffff80),pIdx_00,pFKey_00,
                           (int *)CONCAT44(in_stack_ffffffffffffff6c,uVar10),(int)db_00,
                           in_stack_ffffffffffffffa8,(int)in_R8);
            in_stack_ffffffffffffff08 = iVar7;
            in_stack_ffffffffffffff18 = uVar10;
          }
          sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        }
      }
    }
    for (local_68 = sqlite3FkReferences((Table *)0x214048); local_68 != (FKey *)0x0;
        local_68 = local_68->pNextTo) {
      pParse_00 = (Parse *)0x0;
      if (((in_R8 == (FKey *)0x0) ||
          (iVar5 = fkParentIsModified((Table *)in_stack_ffffffffffffff38,
                                      (FKey *)CONCAT44(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30),
                                      (int *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24),
          iVar5 != 0)) &&
         ((local_68->isDeferred != '\0' ||
          ((((db_00->flags & 0x80000) != 0 || (in_RDI->pToplevel != (Parse *)0x0)) ||
           (in_RDI->isMultiWrite != '\0')))))) {
        iVar5 = sqlite3FkLocateIndex
                          ((Parse *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (Table *)in_stack_ffffffffffffff60,
                           (FKey *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (Index **)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (int **)in_stack_ffffffffffffff48);
        if (iVar5 == 0) {
          pSVar9 = sqlite3SrcListAppend
                             (in_stack_ffffffffffffff38,
                              (SrcList *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (Token *)in_stack_ffffffffffffff28,
                              (Token *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                             );
          if (pSVar9 != (SrcList *)0x0) {
            in_stack_ffffffffffffff38 = (Parse *)pSVar9->a;
            pSVar9->a[0].pSTab = local_68->pFrom;
            ((SrcItem *)in_stack_ffffffffffffff38)->zName = local_68->pFrom->zName;
            pTVar2 = pSVar9->a[0].pSTab;
            pTVar2->nTabRef = pTVar2->nTabRef + 1;
            iVar5 = in_RDI->nTab;
            in_RDI->nTab = iVar5 + 1;
            pSVar9->a[0].iCursor = iVar5;
            iVar5 = in_EDX;
            if (in_ECX != 0) {
              in_stack_ffffffffffffff10 = 0xffffffff;
              iVar5 = in_ECX;
              fkScanChildren(pParse_00,(SrcList *)in_RDI,in_RSI,(Index *)CONCAT44(in_EDX,in_ECX),
                             in_R8,(int *)CONCAT44(in_R9D,in_stack_ffffffffffffffa8),
                             in_stack_00000020,in_stack_00000028);
              in_stack_ffffffffffffff08 = in_ECX;
              in_ECX = iVar5;
              iVar5 = in_EDX;
            }
            in_EDX = iVar5;
            if (iVar5 != 0) {
              in_stack_ffffffffffffff34 = (uint)local_68->aAction[(int)(uint)(in_R8 != (FKey *)0x0)]
              ;
              if ((db_00->flags & 0x800000000) != 0) {
                in_stack_ffffffffffffff34 = 0;
              }
              in_stack_ffffffffffffff10 = 1;
              fkScanChildren(pParse_00,(SrcList *)in_RDI,in_RSI,(Index *)CONCAT44(iVar5,in_ECX),
                             in_R8,(int *)CONCAT44(in_R9D,in_stack_ffffffffffffffa8),
                             in_stack_00000020,in_stack_00000028);
              in_stack_ffffffffffffff08 = iVar5;
              if (((local_68->isDeferred == '\0') && (in_stack_ffffffffffffff34 != 10)) &&
                 (in_stack_ffffffffffffff34 != 8)) {
                sqlite3MayAbort(in_RDI);
                in_stack_ffffffffffffff08 = iVar5;
              }
            }
            in_stack_ffffffffffffff38->db = (sqlite3 *)0x0;
            sqlite3SrcListDelete
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (SrcList *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          }
          sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        }
        else if ((uVar4 == 0) || (db_00->mallocFailed != '\0')) break;
      }
    }
  }
LAB_0021434c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;
  if( !IsOrdinaryTable(pTab) ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index
    ** on the parent key columns in the parent table. If either of these
    ** schema items cannot be located, set an error in pParse and return
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iFromCol, iReg;
          iFromCol = pFKey->aCol[i].iFrom;
          iReg = sqlite3TableColumnToStorage(pFKey->pFrom,iFromCol) + regOld+1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zCnName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate
    ** a cursor to use to search the unique index on the parent key columns
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint.
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs)
     && !pParse->pToplevel && !pParse->isMultiWrite
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( pSrc ){
      SrcItem *pItem = pSrc->a;
      pItem->pSTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pSTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;

      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        if( (db->flags & SQLITE_FkNoAction) ) eAction = OE_None;

        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action
        ** trigger causes other triggers or action rules attached to the
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}